

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Alpha::emulate_mthd(MthdEmuEmuD3D0Alpha *this)

{
  MthdEmuEmuD3D0Alpha *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xffffff00 | (this->super_SingleMthdTest).super_MthdTest.val & 0xff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xfffff0ff |
         (uint)(((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c) - 1 &
                0xf) << 8);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xffffefff | 0x1000;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1c,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_config_a,true);
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffbffff |
       0x40000;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.bundle_config_a, 0, 8, val);
			insrt(exp.bundle_config_a, 8, 4, extr(val, 8, 4) - 1);
			insrt(exp.bundle_config_a, 12, 1, 1);
			pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, true);
		}
		insrt(exp.valid[1], 18, 1, 1);
	}